

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

void __thiscall File::append(File *this,string *line)

{
  int iVar1;
  char *pcVar2;
  string *__return_storage_ptr__;
  int *piVar3;
  int in_EDX;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *line_local;
  File *this_local;
  
  local_18 = line;
  line_local = (string *)this;
  if (this->_fh == (FILE *)0x0) {
    open(this,(char *)line,in_EDX);
  }
  if (this->_fh != (FILE *)0x0) {
    fseek((FILE *)this->_fh,0,2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = fputs(pcVar2,(FILE *)this->_fh);
    if (iVar1 == -1) {
      __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"fputs error {1}: {2}",&local_39);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      format<int,char*>(__return_storage_ptr__,&local_38,iVar1,pcVar2);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

void File::append (const std::string& line)
{
  if (!_fh)
    open ();

  if (_fh)
  {
    fseek (_fh, 0, SEEK_END);

    if (fputs (line.c_str (), _fh) == EOF)
      throw format ("fputs error {1}: {2}", errno, strerror (errno));
  }
}